

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_StoreGetEntrySimple
              (Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  int iVar1;
  int *local_50;
  Ses_TimesEntry_t *pTiEntry;
  Ses_TruthEntry_t *pTEntry;
  int key;
  char **pSol_local;
  int *pArrTimeProfile_local;
  int nVars_local;
  word *pTruth_local;
  Ses_Store_t *pStore_local;
  
  iVar1 = Ses_StoreTableHash(pTruth,nVars);
  pTiEntry = (Ses_TimesEntry_t *)pStore->pEntries[iVar1];
  while ((pTiEntry != (Ses_TimesEntry_t *)0x0 &&
         (iVar1 = Ses_StoreTruthEqual((Ses_TruthEntry_t *)pTiEntry,pTruth,nVars), iVar1 == 0))) {
    pTiEntry = pTiEntry->next;
  }
  if (pTiEntry == (Ses_TimesEntry_t *)0x0) {
    pStore_local._4_4_ = 0;
  }
  else {
    local_50 = (int *)pTiEntry->pNetwork;
    while ((local_50 != (int *)0x0 &&
           (iVar1 = Ses_StoreTimesEqual(pArrTimeProfile,local_50,nVars), iVar1 == 0))) {
      local_50 = *(int **)(local_50 + 10);
    }
    if (local_50 == (int *)0x0) {
      pStore_local._4_4_ = 0;
    }
    else {
      *pSol = *(char **)(local_50 + 0xc);
      pStore_local._4_4_ = 1;
    }
  }
  return pStore_local._4_4_;
}

Assistant:

int Ses_StoreGetEntrySimple( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}